

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::TimecodeComponent::TimecodeComponent(TimecodeComponent *this,TimecodeComponent *rhs)

{
  byte_t *value;
  UL local_38;
  TimecodeComponent *local_18;
  TimecodeComponent *rhs_local;
  TimecodeComponent *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  StructuralComponent::StructuralComponent
            (&this->super_StructuralComponent,
             (rhs->super_StructuralComponent).super_InterchangeObject.m_Dict);
  (this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__TimecodeComponent_0033a490;
  if ((this->super_StructuralComponent).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_StructuralComponent).super_InterchangeObject.m_Dict,
                           MDD_TimecodeComponent);
    UL::UL(&local_38,value);
    UL::operator=(&(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_38);
    UL::~UL(&local_38);
    (*(this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket
      [0x14])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x4c0,"ASDCP::MXF::TimecodeComponent::TimecodeComponent(const TimecodeComponent &)"
               );
}

Assistant:

TimecodeComponent::TimecodeComponent(const TimecodeComponent& rhs) : StructuralComponent(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_TimecodeComponent);
  Copy(rhs);
}